

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles3::Functional::eval_distance_vec3(ShaderEvalContext *c)

{
  float fVar1;
  Vector<float,_3> local_20;
  Vector<float,_3> local_14;
  
  local_14.m_data[0] = c->in[0].m_data[2];
  local_14.m_data._4_8_ = *(undefined8 *)c->in[0].m_data;
  local_20.m_data[2] = c->in[1].m_data[0];
  local_20.m_data._0_8_ = *(undefined8 *)(c->in[1].m_data + 1);
  fVar1 = tcu::distance<float,3>(&local_14,&local_20);
  (c->color).m_data[0] = fVar1;
  return;
}

Assistant:

void eval_cross_vec3 (ShaderEvalContext& c) { c.color.xyz()	= cross(c.in[0].swizzle(2, 0, 1), c.in[1].swizzle(1, 2, 0)); }